

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objnam.c
# Opt level: O3

char * the(char *str)

{
  char cVar1;
  int iVar2;
  long lVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  size_t sVar8;
  char *pcVar9;
  
  iVar2 = nextobuf_bufidx + 1 >> 0x1f;
  nextobuf_bufidx =
       nextobuf_bufidx + (((uint)((nextobuf_bufidx + 1) / 6 + iVar2) >> 1) - iVar2) * -0xc + 1;
  lVar3 = (long)nextobuf_bufidx * 0x100;
  pcVar9 = nextobuf_bufs + lVar3;
  iVar2 = strncasecmp(str,"the ",4);
  if (iVar2 == 0) {
    cVar1 = lowc(*str);
    *pcVar9 = cVar1;
    strcpy(nextobuf_bufs + lVar3 + 1,str + 1);
    return pcVar9;
  }
  if ((byte)(*str + 0xa5U) < 0xe6) {
LAB_00204884:
    nextobuf_bufs[lVar3 + 4] = 0;
    builtin_strncpy(nextobuf_bufs + lVar3,"the ",4);
  }
  else {
    pcVar4 = strrchr(str,0x20);
    if ((pcVar4 != (char *)0x0) || (pcVar4 = strrchr(str,0x2d), pcVar4 != (char *)0x0)) {
      if ((byte)(pcVar4[1] + 0xa5U) < 0xe6) goto LAB_00204884;
      pcVar5 = strchr(str,0x20);
      if (pcVar5 < pcVar4) {
        pcVar5 = strstri(str," of ");
        pcVar6 = strstri(str," named ");
        pcVar7 = strstri(str," called ");
        pcVar4 = pcVar6;
        if (pcVar7 < pcVar6) {
          pcVar4 = pcVar7;
        }
        if (pcVar6 == (char *)0x0) {
          pcVar4 = pcVar7;
        }
        if (pcVar7 == (char *)0x0) {
          pcVar4 = pcVar6;
        }
        if (pcVar5 == (char *)0x0) {
          if (pcVar4 == (char *)0x0) {
            sVar8 = strlen(str);
            if ((0x1e < (int)sVar8) &&
               (iVar2 = strcmp(str + ((int)sVar8 - 0x1f),"Platinum Yendorian Express Card"),
               iVar2 == 0)) goto LAB_00204884;
          }
        }
        else if (pcVar5 < pcVar4 || pcVar4 == (char *)0x0) goto LAB_00204884;
      }
    }
    *pcVar9 = '\0';
  }
  pcVar9 = strcat(pcVar9,str);
  return pcVar9;
}

Assistant:

char *the(const char *str)
{
	char *buf = nextobuf();
	boolean insert_the = FALSE;

	if (!strncmpi(str, "the ", 4)) {
	    buf[0] = lowc(*str);
	    strcpy(&buf[1], str+1);
	    return buf;
	} else if (*str < 'A' || *str > 'Z') {
	    /* not a proper name, needs an article */
	    insert_the = TRUE;
	} else {
	    /* Probably a proper name, might not need an article */
	    char *tmp, *named, *called;
	    int l;

	    /* some objects have capitalized adjectives in their names */
	    if (((tmp = strrchr(str, ' ')) || (tmp = strrchr(str, '-'))) &&
	       (tmp[1] < 'A' || tmp[1] > 'Z'))
		insert_the = TRUE;
	    else if (tmp && strchr(str, ' ') < tmp) {	/* has spaces */
		/* it needs an article if the name contains "of" */
		tmp = strstri(str, " of ");
		named = strstri(str, " named ");
		called = strstri(str, " called ");
		if (called && (!named || called < named)) named = called;

		if (tmp && (!named || tmp < named))	/* found an "of" */
		    insert_the = TRUE;
		/* stupid special case: lacks "of" but needs "the" */
		else if (!named && (l = strlen(str)) >= 31 &&
		      !strcmp(&str[l - 31], "Platinum Yendorian Express Card"))
		    insert_the = TRUE;
	    }
	}
	if (insert_the)
	    strcpy(buf, "the ");
	else
	    buf[0] = '\0';
	strcat(buf, str);

	return buf;
}